

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O1

int trico_read_attributes_double(void *a,double **attrib)

{
  long lVar1;
  int iVar2;
  undefined4 *puVar3;
  uint *puVar4;
  bool bVar5;
  undefined8 in_RAX;
  uint8_t *compressed;
  size_t __size;
  int iVar6;
  uint32_t nr_of_doubles;
  undefined8 local_38;
  
  iVar6 = 0;
  if (*(int *)((long)a + 0x24) == 0x10) {
    iVar2 = *(int *)((long)a + 0x40);
    bVar5 = true;
    local_38 = in_RAX;
    if ((iVar2 == 0) &&
       (puVar3 = *(undefined4 **)((long)a + 0x18),
       (ulong)((long)puVar3 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
      local_38._4_4_ = (int)((ulong)in_RAX >> 0x20);
      local_38 = CONCAT44(local_38._4_4_,*puVar3);
      *(undefined4 **)((long)a + 0x18) = puVar3 + 1;
      bVar5 = false;
    }
    iVar6 = 0;
    if (!bVar5) {
      bVar5 = true;
      iVar6 = 0;
      if ((iVar2 == 0) &&
         (puVar4 = *(uint **)((long)a + 0x18),
         (ulong)((long)puVar4 + (4 - *(long *)((long)a + 0x10))) <= *(ulong *)((long)a + 0x30))) {
        __size = (size_t)*puVar4;
        *(uint **)((long)a + 0x18) = puVar4 + 1;
        bVar5 = false;
      }
      else {
        __size = 0;
      }
      if ((!bVar5) && (compressed = (uint8_t *)malloc(__size), iVar2 == 0)) {
        lVar1 = __size + (long)*(void **)((long)a + 0x18);
        if ((ulong)(lVar1 - *(long *)((long)a + 0x10)) <= *(ulong *)((long)a + 0x30)) {
          memcpy(compressed,*(void **)((long)a + 0x18),__size);
          *(long *)((long)a + 0x18) = lVar1;
          if (attrib != (double **)0x0) {
            trico_decompress_double_precision((uint32_t *)((long)&local_38 + 4),attrib,compressed);
            if (local_38._4_4_ != (int)local_38) {
              __assert_fail("nr_of_doubles == nr_attrib",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]trico/trico/trico.c"
                            ,0x581,"int trico_read_attributes_double(void *, double **)");
            }
          }
          free(compressed);
          read_next_stream_type((trico_archive *)a);
          iVar6 = 1;
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int trico_read_attributes_double(void* a, double** attrib)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  if (trico_get_next_stream_type(arch) != trico_attribute_double_stream)
    return 0;

  uint32_t nr_attrib;
  if (!read(&nr_attrib, sizeof(uint32_t), 1, arch))
    return 0;

  uint32_t nr_of_compressed_bytes;
  if (!read(&nr_of_compressed_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  void* compressed = trico_malloc(nr_of_compressed_bytes);
  if (!read(compressed, 1, nr_of_compressed_bytes, arch))
    return 0;
  uint32_t nr_of_doubles;

  if (attrib != NULL)
    {
    trico_decompress_double_precision(&nr_of_doubles, attrib, (const uint8_t*)compressed);
    assert(nr_of_doubles == nr_attrib);
    }

  trico_free(compressed);
  

  read_next_stream_type(arch);

  return 1;
  }